

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

void __thiscall
JsUtil::
List<Wasm::CustomSection,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
EnsureArray(List<Wasm::CustomSection,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *this,int32 requiredCapacity)

{
  CustomSection *src;
  bool bVar1;
  int *piVar2;
  Type *pTVar3;
  Type *oldbuffer;
  Type *newbuffer;
  int32 local_20;
  int32 oldBufferSize;
  int32 newBufferSize;
  int32 newLength;
  int32 newSize;
  int32 requiredCapacity_local;
  List<Wasm::CustomSection,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_local;
  
  newLength = requiredCapacity;
  _newSize = this;
  if ((this->super_ReadOnlyList<Wasm::CustomSection,_Memory::ArenaAllocator,_DefaultComparer>).
      buffer == (Type)0x0) {
    piVar2 = max<int>(&newLength,&this->increment);
    newBufferSize = *piVar2;
    pTVar3 = AllocArray(this,newBufferSize);
    (this->super_ReadOnlyList<Wasm::CustomSection,_Memory::ArenaAllocator,_DefaultComparer>).buffer
         = pTVar3;
    (this->super_ReadOnlyList<Wasm::CustomSection,_Memory::ArenaAllocator,_DefaultComparer>).count =
         0;
    this->length = newBufferSize;
  }
  else if (((this->super_ReadOnlyList<Wasm::CustomSection,_Memory::ArenaAllocator,_DefaultComparer>)
            .count == this->length) || (this->length < requiredCapacity)) {
    oldBufferSize = 0;
    local_20 = 0;
    newbuffer._4_4_ = 0;
    bVar1 = Int32Math::Add(this->length,1,&oldBufferSize);
    if ((bVar1) || (bVar1 = Int32Math::Shl(oldBufferSize,1,&oldBufferSize), bVar1)) {
      ExternalApi::RaiseOnIntOverflow();
    }
    piVar2 = max<int>(&newLength,&oldBufferSize);
    oldBufferSize = *piVar2;
    bVar1 = Int32Math::Mul(0x20,oldBufferSize,&local_20);
    if ((bVar1) ||
       (bVar1 = Int32Math::Mul(0x20,this->length,(int32 *)((long)&newbuffer + 4)), bVar1)) {
      ExternalApi::RaiseOnIntOverflow();
    }
    pTVar3 = AllocArray(this,oldBufferSize);
    src = (this->super_ReadOnlyList<Wasm::CustomSection,_Memory::ArenaAllocator,_DefaultComparer>).
          buffer;
    Memory::CopyArray<Wasm::CustomSection,Wasm::CustomSection,Memory::ArenaAllocator>
              (pTVar3,(long)oldBufferSize,src,(long)this->length);
    FreeArray(this,src,newbuffer._4_4_);
    this->length = oldBufferSize;
    (this->super_ReadOnlyList<Wasm::CustomSection,_Memory::ArenaAllocator,_DefaultComparer>).buffer
         = pTVar3;
  }
  return;
}

Assistant:

void EnsureArray(DECLSPEC_GUARD_OVERFLOW int32 requiredCapacity)
        {
            if (this->buffer == nullptr)
            {
                int32 newSize = max(requiredCapacity, increment);

                this->buffer = AllocArray(newSize);
                this->count = 0;
                this->length = newSize;
            }
            else if (this->count == length || requiredCapacity > this->length)
            {
                int32 newLength = 0, newBufferSize = 0, oldBufferSize = 0;

                if (Int32Math::Add(length, 1u, &newLength)
                    || Int32Math::Shl(newLength, 1u, &newLength))
                {
                    JsUtil::ExternalApi::RaiseOnIntOverflow();
                }

                newLength = max(requiredCapacity, newLength);

                if (Int32Math::Mul(sizeof(T), newLength, &newBufferSize)
                    || Int32Math::Mul(sizeof(T), length, &oldBufferSize))
                {
                    JsUtil::ExternalApi::RaiseOnIntOverflow();
                }

                Field(T, TAllocator)* newbuffer = AllocArray(newLength);
                Field(T, TAllocator)* oldbuffer = this->buffer;
                CopyArray<Field(T, TAllocator), Field(T, TAllocator), EffectiveAllocatorType>(
                    newbuffer, newLength, oldbuffer, length);

                FreeArray(oldbuffer, oldBufferSize);

                this->length = newLength;
                this->buffer = newbuffer;
            }
        }